

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_linalg.c
# Opt level: O0

void ScaleVector(cupdlp_float weight,cupdlp_float *x,cupdlp_int n)

{
  int i;
  cupdlp_int n_local;
  cupdlp_float *x_local;
  cupdlp_float weight_local;
  
  for (i = 0; i < n; i = i + 1) {
    x[i] = weight * x[i];
  }
  return;
}

Assistant:

void ScaleVector(cupdlp_float weight, cupdlp_float *x, cupdlp_int n) {
#ifdef USE_MY_BLAS

  for (int i = 0; i < n; ++i) {
    x[i] *= weight;
  }

#else
  return ddot(n, x, incx, y, incy);
#endif
}